

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  stbi__uint32 sVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  byte bVar6;
  char *pcVar7;
  uint uVar8;
  int *piVar9;
  uint uVar10;
  long lVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  bool bVar17;
  short *psVar11;
  
  psVar11 = data;
  if (j->spec_end == 0) {
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    if (j->succ_high != 0) {
      if (j->code_bits < 1) {
        stbi__grow_buffer_unsafe(j);
      }
      if (j->code_bits < 1) {
        return 1;
      }
      sVar1 = j->code_buffer;
      j->code_buffer = sVar1 * 2;
      j->code_bits = j->code_bits + -1;
      if (-1 < (int)sVar1) {
        return 1;
      }
      *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
      return 1;
    }
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (j->code_bits < 0x10) {
      stbi__grow_buffer_unsafe(j);
    }
    uVar8 = j->code_buffer;
    piVar9 = (int *)(ulong)uVar8;
    uVar5 = (ulong)hdc->fast[uVar8 >> 0x17];
    if (uVar5 == 0xff) {
      lVar13 = 0;
      do {
        lVar12 = lVar13;
        lVar13 = lVar12 + 1;
      } while (hdc->maxcode[lVar12 + 10] <= uVar8 >> 0x10);
      uVar10 = j->code_bits;
      psVar11 = (short *)(ulong)uVar10;
      if (lVar13 == 8) {
        psVar11 = (short *)(ulong)(uVar10 - 0x10);
        j->code_bits = uVar10 - 0x10;
        uVar3 = 0xffffffff;
      }
      else {
        uVar3 = 0xffffffff;
        if (((int)(lVar12 + 10) <= (int)uVar10) &&
           (uVar14 = (uVar8 >> (0x17U - (char)lVar13 & 0x1f) & stbi__bmask[lVar12 + 10]) +
                     hdc->delta[lVar12 + 10], uVar14 < 0x100)) {
          uVar10 = (uVar10 - (int)lVar13) - 9;
          psVar11 = (short *)(ulong)uVar10;
          uVar8 = uVar8 << ((byte)(lVar12 + 10) & 0x1f);
          j->code_bits = uVar10;
          j->code_buffer = uVar8;
          uVar5 = (ulong)uVar14;
          goto LAB_00139939;
        }
      }
    }
    else {
      bVar6 = hdc->size[uVar5];
      uVar3 = 0xffffffff;
      uVar10 = j->code_bits - (uint)bVar6;
      psVar11 = (short *)(ulong)uVar10;
      if ((int)(uint)bVar6 <= j->code_bits) {
        uVar8 = uVar8 << (bVar6 & 0x1f);
        j->code_buffer = uVar8;
        j->code_bits = uVar10;
LAB_00139939:
        piVar9 = (int *)(ulong)uVar8;
        uVar3 = (uint)hdc->values[uVar5];
      }
    }
    hdc = (stbi__huffman *)piVar9;
    if (uVar3 < 0x10) {
      uVar8 = 0;
      if (uVar3 != 0) {
        if (j->code_bits < (int)uVar3) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar10 = j->code_bits - uVar3;
        piVar9 = (int *)(ulong)uVar10;
        uVar8 = 0;
        if ((int)uVar3 <= j->code_bits) {
          uVar8 = j->code_buffer;
          bVar6 = (byte)uVar3 & 0x1f;
          uVar2 = uVar8 << bVar6 | uVar8 >> 0x20 - bVar6;
          uVar14 = stbi__bmask[uVar3];
          j->code_buffer = ~uVar14 & uVar2;
          j->code_bits = uVar10;
          iVar15 = 0;
          if (-1 < (int)uVar8) {
            piVar9 = stbi__jbias;
            iVar15 = stbi__jbias[uVar3];
          }
          uVar8 = iVar15 + (uVar2 & uVar14);
        }
      }
      uVar10 = j->img_comp[b].dc_pred;
      hdc = (stbi__huffman *)piVar9;
      if (-1 < (int)(uVar10 ^ uVar8)) {
        bVar16 = (int)(-0x80000000 - uVar8) <= (int)uVar10;
        hdc = (stbi__huffman *)(ulong)bVar16;
        bVar17 = (int)uVar10 <= (int)(uVar8 ^ 0x7fffffff);
        if ((int)(uVar10 & uVar8) < 0) {
          bVar17 = bVar16;
        }
        if (!bVar17) {
          puVar4 = (undefined8 *)__tls_get_addr(&PTR_00164d50);
          pcVar7 = "bad delta";
          goto LAB_00139830;
        }
      }
      uVar10 = uVar10 + uVar8;
      psVar11 = (short *)(ulong)uVar10;
      j->img_comp[b].dc_pred = uVar10;
      bVar6 = (byte)j->succ_low;
      uVar8 = 1 << (bVar6 & 0x1f);
      if ((int)(uVar8 ^ uVar10) < 0) {
        if (j->succ_low == 0x1f) {
          bVar17 = false;
          bVar16 = uVar10 == 0;
          uVar8 = uVar10;
        }
        else {
          uVar3 = -0x8000 / (int)uVar8;
          hdc = (stbi__huffman *)(ulong)(uint)(-0x8000 % (int)uVar8);
          bVar17 = SBORROW4(uVar3,uVar10);
          uVar8 = uVar3 - uVar10;
          bVar16 = uVar3 == uVar10;
        }
        bVar16 = bVar16 || bVar17 != (int)uVar8 < 0;
      }
      else {
        bVar16 = (int)uVar10 <= (int)(0x7fffU >> (bVar6 & 0x1f));
      }
      if (bVar16) {
        *data = (short)(uVar10 << (bVar6 & 0x1f));
        return 1;
      }
    }
  }
  puVar4 = (undefined8 *)__tls_get_addr(&PTR_00164d50,psVar11,hdc);
  pcVar7 = "can\'t merge dc and ac";
LAB_00139830:
  *puVar4 = pcVar7;
  return 0;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}